

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustumTest.h
# Opt level: O2

bool __thiscall
Imath_3_2::FrustumTest<float>::completelyContains
          (FrustumTest<float> *this,Box<Imath_3_2::Vec3<float>_> *box)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  bool bVar35;
  undefined4 in_ECX;
  uint uVar36;
  int iVar37;
  int iVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  
  bVar35 = Box<Imath_3_2::Vec3<float>_>::isEmpty(box);
  if (bVar35) {
    bVar35 = false;
  }
  else {
    fVar41 = (box->max).x;
    fVar42 = ((box->min).x + fVar41) * 0.5;
    fVar41 = fVar41 - fVar42;
    uVar1 = (box->min).y;
    uVar17 = (box->min).z;
    uVar2 = (box->max).y;
    uVar18 = (box->max).z;
    fVar43 = ((float)uVar1 + (float)uVar2) * 0.5;
    fVar44 = ((float)uVar17 + (float)uVar18) * 0.5;
    fVar39 = (float)uVar2 - fVar43;
    fVar40 = (float)uVar18 - fVar44;
    uVar3 = this->planeNormX[0].x;
    uVar19 = this->planeNormX[0].y;
    uVar4 = this->planeNormY[0].x;
    uVar20 = this->planeNormY[0].y;
    uVar5 = this->planeNormZ[0].x;
    uVar21 = this->planeNormZ[0].y;
    uVar6 = this->planeOffsetVec[0].x;
    uVar22 = this->planeOffsetVec[0].y;
    uVar7 = this->planeNormAbsX[0].x;
    uVar23 = this->planeNormAbsX[0].y;
    uVar8 = this->planeNormAbsY[0].x;
    uVar24 = this->planeNormAbsY[0].y;
    uVar9 = this->planeNormAbsZ[0].x;
    uVar25 = this->planeNormAbsZ[0].y;
    iVar37 = -(uint)(0.0 <= ((float)uVar9 * fVar40 +
                            (float)uVar8 * fVar39 +
                            (float)uVar7 * fVar41 +
                            (float)uVar5 * fVar44 + (float)uVar4 * fVar43 + (float)uVar3 * fVar42) -
                            (float)uVar6);
    iVar38 = -(uint)(0.0 <= ((float)uVar25 * fVar40 +
                            (float)uVar24 * fVar39 +
                            (float)uVar23 * fVar41 +
                            (float)uVar21 * fVar44 + (float)uVar20 * fVar43 + (float)uVar19 * fVar42
                            ) - (float)uVar22);
    auVar34._4_4_ = iVar37;
    auVar34._0_4_ = iVar37;
    auVar34._8_4_ = iVar38;
    auVar34._12_4_ = iVar38;
    uVar36 = movmskpd(in_ECX,auVar34);
    bVar35 = false;
    if ((((uVar36 & 1) == 0) && (bVar35 = false, (byte)((byte)uVar36 >> 1) == 0)) &&
       ((this->planeNormAbsZ[0].z * fVar40 +
        this->planeNormAbsY[0].z * fVar39 +
        this->planeNormAbsX[0].z * fVar41 +
        this->planeNormZ[0].z * fVar44 +
        this->planeNormY[0].z * fVar43 + this->planeNormX[0].z * fVar42) - this->planeOffsetVec[0].z
        < 0.0)) {
      uVar10 = this->planeNormX[1].x;
      uVar26 = this->planeNormX[1].y;
      uVar11 = this->planeNormY[1].x;
      uVar27 = this->planeNormY[1].y;
      uVar12 = this->planeNormZ[1].x;
      uVar28 = this->planeNormZ[1].y;
      uVar13 = this->planeOffsetVec[1].x;
      uVar29 = this->planeOffsetVec[1].y;
      uVar14 = this->planeNormAbsX[1].x;
      uVar30 = this->planeNormAbsX[1].y;
      uVar15 = this->planeNormAbsY[1].x;
      uVar31 = this->planeNormAbsY[1].y;
      uVar16 = this->planeNormAbsZ[1].x;
      uVar32 = this->planeNormAbsZ[1].y;
      iVar37 = -(uint)((fVar40 * (float)uVar16 +
                       fVar39 * (float)uVar15 +
                       fVar41 * (float)uVar14 +
                       fVar44 * (float)uVar12 + fVar43 * (float)uVar11 + fVar42 * (float)uVar10) -
                       (float)uVar13 < 0.0);
      iVar38 = -(uint)((fVar40 * (float)uVar32 +
                       fVar39 * (float)uVar31 +
                       fVar41 * (float)uVar30 +
                       fVar44 * (float)uVar28 + fVar43 * (float)uVar27 + fVar42 * (float)uVar26) -
                       (float)uVar29 < 0.0);
      auVar33._4_4_ = iVar37;
      auVar33._0_4_ = iVar37;
      auVar33._8_4_ = iVar38;
      auVar33._12_4_ = iVar38;
      iVar37 = movmskpd(0,auVar33);
      bVar35 = (fVar40 * this->planeNormAbsZ[1].z +
               fVar41 * this->planeNormAbsX[1].z +
               this->planeNormZ[1].z * fVar44 +
               fVar43 * this->planeNormY[1].z + fVar42 * this->planeNormX[1].z +
               fVar39 * this->planeNormAbsY[1].z) - this->planeOffsetVec[1].z < 0.0 && iVar37 == 3;
    }
  }
  return bVar35;
}

Assistant:

bool
FrustumTest<T>::completelyContains (const Box<Vec3<T>>& box) const
    IMATH_NOEXCEPT
{
    if (box.isEmpty ()) return false;

    Vec3<T> center = (box.min + box.max) / 2;
    Vec3<T> extent = (box.max - center);

    // This is a vertical dot-product on three vectors at once.
    Vec3<T> d0 = planeNormX[0] * center.x + planeNormY[0] * center.y +
                 planeNormZ[0] * center.z + planeNormAbsX[0] * extent.x +
                 planeNormAbsY[0] * extent.y + planeNormAbsZ[0] * extent.z -
                 planeOffsetVec[0];

    if (d0.x >= 0 || d0.y >= 0 || d0.z >= 0) return false;

    Vec3<T> d1 = planeNormX[1] * center.x + planeNormY[1] * center.y +
                 planeNormZ[1] * center.z + planeNormAbsX[1] * extent.x +
                 planeNormAbsY[1] * extent.y + planeNormAbsZ[1] * extent.z -
                 planeOffsetVec[1];

    if (d1.x >= 0 || d1.y >= 0 || d1.z >= 0) return false;

    return true;
}